

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverAlternatingMaximization.h
# Opt level: O0

bool __thiscall
BGIP_SolverAlternatingMaximization<JointPolicyPureVector>::GetNextJointPolicyAndValueSpecific
          (BGIP_SolverAlternatingMaximization<JointPolicyPureVector> *this,
          shared_ptr<JointPolicyDiscretePure> *jpol,double *value)

{
  bool bVar1;
  type pJVar2;
  type pPVar3;
  undefined8 *in_RDX;
  long *in_RDI;
  undefined8 uVar4;
  shared_ptr<PartialJPDPValuePair> jppv_1;
  shared_ptr<JPPVValuePair> jppv;
  bool foundSolution;
  BayesianGameIdenticalPayoffSolver *in_stack_ffffffffffffff88;
  BayesianGameIdenticalPayoffSolver *this_00;
  shared_ptr<JointPolicyDiscretePure> *in_stack_ffffffffffffffa0;
  BayesianGameIdenticalPayoffSolver local_50 [32];
  shared_ptr<JPPVValuePair> local_30 [23];
  byte local_19;
  undefined8 *local_18;
  
  local_18 = in_RDX;
  if ((*(byte *)(in_RDI + 0x24) & 1) == 0) {
    (**(code **)(*in_RDI + 0x20))();
  }
  local_19 = 0;
  *local_18 = 0;
  bVar1 = BayesianGameIdenticalPayoffSolver::IsEmptyJPPV
                    ((BayesianGameIdenticalPayoffSolver *)0x14caad);
  if (bVar1) {
    bVar1 = BayesianGameIdenticalPayoffSolver::IsEmptyPJPDP
                      ((BayesianGameIdenticalPayoffSolver *)0x14cb28);
    if (!bVar1) {
      this_00 = local_50;
      BayesianGameIdenticalPayoffSolver::GetNextSolutionPJPDP(this_00);
      pPVar3 = boost::shared_ptr<PartialJPDPValuePair>::operator->
                         ((shared_ptr<PartialJPDPValuePair> *)this_00);
      uVar4 = (**(code **)(*(long *)pPVar3 + 0x18))();
      *local_18 = uVar4;
      boost::shared_ptr<PartialJPDPValuePair>::~shared_ptr
                ((shared_ptr<PartialJPDPValuePair> *)0x14cb75);
    }
  }
  else {
    BayesianGameIdenticalPayoffSolver::GetNextSolutionJPPV(in_stack_ffffffffffffff88);
    pJVar2 = boost::shared_ptr<JPPVValuePair>::operator->(local_30);
    in_stack_ffffffffffffffa0 =
         (shared_ptr<JointPolicyDiscretePure> *)(**(code **)(*(long *)pJVar2 + 0x18))();
    *local_18 = in_stack_ffffffffffffffa0;
    boost::shared_ptr<JPPVValuePair>::~shared_ptr((shared_ptr<JPPVValuePair> *)0x14cafc);
  }
  if ((local_19 & 1) == 0) {
    boost::shared_ptr<JointPolicyDiscretePure>::reset(in_stack_ffffffffffffffa0);
    *local_18 = 0;
  }
  return (bool)(local_19 & 1);
}

Assistant:

bool GetNextJointPolicyAndValueSpecific(boost::shared_ptr<JointPolicyDiscretePure> &jpol, double &value)
    {
        if(!_m_solved)
            Solve();

        // since BFS computes all solutions. we just need to get
        // the next one from the solution and return it

        bool foundSolution = false;
        value = 0;

        // this requires some magic to make sure we return from
        // the correct pool, which depends on the JP type
        if(!this->IsEmptyJPPV())
        {                
            const boost::shared_ptr<JPPVValuePair> jppv=
                this->GetNextSolutionJPPV();
            value = jppv->GetValue();
        }
        else if(!this->IsEmptyPJPDP())
        {
            //alright, if I understand it correctly, it tries to convert the policy returned
            //to a "JointPolicyPureVectorForClusteredBG"

            const boost::shared_ptr<PartialJPDPValuePair> jppv=
                this->GetNextSolutionPJPDP();
            value = jppv->GetValue();
        }

        if(!foundSolution)
        {
//                std::cout << "value " << value << " " <<  this->_m_nrSolutionsReturned <<  " "
//                          << this->GetNrDesiredSolutions() << " " 
//                          << this->GetBGIPI()->GetNrJointPolicies() << std::endl;
            jpol.reset();
            value = 0;
        }

        return(foundSolution);
    }